

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O3

bool tinyusdz::prim::ReconstructPrim<tinyusdz::GeomSubset>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,GeomSubset *subset
               ,string *warn,string *err,PrimReconstructOptions *options)

{
  Attribute *pAVar1;
  anon_struct_8_0_00000001_for___align *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_struct_8_0_00000001_for___align *paVar4;
  uint uVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  string sVar8;
  TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *pTVar9;
  string *psVar10;
  size_type sVar11;
  Property *pPVar12;
  ulong uVar13;
  bool bVar14;
  int iVar15;
  ostream *poVar16;
  long lVar17;
  undefined8 *puVar18;
  long *plVar19;
  const_iterator cVar20;
  mapped_type *pmVar21;
  _Base_ptr p_Var22;
  char *pcVar23;
  Collection *coll;
  size_type __n;
  _Rb_tree_header *p_Var24;
  bool bVar25;
  ParseResult ret;
  string attr_type_name;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  stringstream ss;
  TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>
  *in_stack_fffffffffffffcb8;
  undefined1 local_340 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_328;
  undefined1 local_318 [8];
  char *local_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  string local_2f0;
  TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *local_2d0;
  string *local_2c8;
  Attribute *local_2c0;
  string local_2b8;
  Property *local_298;
  AttrMetas *local_290;
  anon_struct_8_0_00000001_for___align local_288;
  optional<tinyusdz::Token> *local_280;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *local_278;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *local_270;
  string *local_268;
  _Base_ptr local_260;
  long *local_258;
  ulong local_250;
  long local_248 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_238;
  long *local_208 [2];
  long local_1f8 [2];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [96];
  ios_base local_178 [16];
  ios_base local_168 [272];
  storage_t<tinyusdz::Token> local_58;
  
  local_238._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_238._M_impl.super__Rb_tree_header._M_header;
  local_238._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bVar25 = false;
  local_238._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_238._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_238._M_impl.super__Rb_tree_header._M_header._M_right =
       local_238._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar14 = anon_unknown_0::ReconstructMaterialBindingProperties
                     ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_238,
                      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                       *)properties,&subset->super_MaterialBinding,err);
  if (bVar14) {
    coll = &subset->super_Collection;
    if (subset == (GeomSubset *)0x0) {
      coll = (Collection *)0x0;
    }
    local_2d0 = (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *)
                err;
    bVar14 = anon_unknown_0::ReconstructCollectionProperties
                       ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_238,
                        (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                         *)properties,coll,warn,err,options->strict_allowedToken_check);
    if (bVar14) {
      p_Var22 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var24 = &(properties->_M_t)._M_impl.super__Rb_tree_header;
      bVar25 = true;
      if ((_Rb_tree_header *)p_Var22 != p_Var24) {
        local_290 = &(subset->familyName)._metas;
        local_270 = &(subset->familyName)._paths;
        local_280 = &(subset->familyName)._attrib;
        local_268 = (string *)&subset->indices;
        local_278 = &subset->props;
        local_298 = (Property *)&subset->elementType;
        local_2c8 = warn;
        local_260 = &p_Var24->_M_header;
        do {
          local_258 = local_248;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_258,*(long *)(p_Var22 + 1),
                     (long)&(p_Var22[1]._M_parent)->_M_color + *(long *)(p_Var22 + 1));
          pAVar1 = (Attribute *)(p_Var22 + 2);
          local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"familyName","");
          uVar13 = local_250;
          sVar11 = local_2b8._M_string_length;
          local_310 = local_308._M_local_buf + 8;
          local_308._M_allocated_capacity = 0;
          local_308._8_8_ = local_308._8_8_ & 0xffffffffffffff00;
          __n = local_250;
          if (local_2b8._M_string_length < local_250) {
            __n = local_2b8._M_string_length;
          }
          if (__n == 0) {
            if (local_250 == local_2b8._M_string_length) goto LAB_00216d17;
LAB_00216f03:
            local_318._0_4_ = 1;
          }
          else {
            iVar15 = bcmp(local_258,local_2b8._M_dataplus._M_p,__n);
            if ((uVar13 != sVar11) || (iVar15 != 0)) goto LAB_00216f03;
LAB_00216d17:
            Attribute::type_name_abi_cxx11_(&local_2f0,pAVar1);
            local_1e8._0_8_ = local_1d8;
            local_1e8._8_8_ = (anon_struct_8_0_00000001_for___align)0x5;
            local_1d8._0_6_ = 0x6e656b6f74;
            paVar4 = (anon_struct_8_0_00000001_for___align *)(local_340 + 0x10);
            if (local_2f0._M_string_length == 5) {
              if ((char)*(int *)(local_2f0._M_dataplus._M_p + 4) != 'n' ||
                  *(int *)local_2f0._M_dataplus._M_p != 0x656b6f74) {
                local_340._8_8_ = (anon_struct_8_0_00000001_for___align)0x5;
                local_340._16_6_ = 0x6e656b6f74;
                local_340._0_8_ = paVar4;
                if ((char)*(int *)(local_2f0._M_dataplus._M_p + 4) != 'n' ||
                    *(int *)local_2f0._M_dataplus._M_p != 0x656b6f74) goto LAB_00216dbb;
              }
              p_Var6 = p_Var22[6]._M_parent;
              p_Var7 = p_Var22[6]._M_left;
              if (p_Var7 != p_Var6) {
                std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                          ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_270,
                           (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                           &p_Var22[6]._M_parent);
              }
              iVar15 = *(int *)((long)&p_Var22[0x17]._M_parent + 4);
              if (iVar15 == 0) {
                lVar17 = 0x208;
LAB_00216f8f:
                (&(((AttrMeta *)&local_290->interpolation)->interpolation).has_value_)[lVar17] =
                     true;
LAB_002170e0:
                AttrMetas::operator=(local_290,(AttrMetas *)(p_Var22 + 7));
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&local_238,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_2b8);
                local_318 = (undefined1  [8])((ulong)local_318 & 0xffffffff00000000);
              }
              else {
                if (iVar15 == 1) {
                  if (p_Var22[3]._M_color != _S_black) {
                    local_318._0_4_ = 4;
                    local_288 = (anon_struct_8_0_00000001_for___align)0x2d;
                    local_340._0_8_ = (anon_struct_8_0_00000001_for___align *)(local_340 + 0x10);
                    local_340._0_8_ =
                         ::std::__cxx11::string::_M_create((ulong *)local_340,(ulong)&local_288);
                    local_340._16_8_ = local_288;
                    *(undefined8 *)local_340._0_8_ = 0x7475626972747441;
                    *(undefined8 *)(local_340._0_8_ + 8) = 0x6d20607d7b602065;
                    *(undefined8 *)(local_340._0_8_ + 0x10) = 0x6020656220747375;
                    *(undefined8 *)(local_340._0_8_ + 0x18) = 0x606d726f66696e75;
                    ((anon_struct_8_0_00000001_for___align *)(local_340._0_8_ + 0x18))->field_0x5 =
                         'r';
                    ((anon_struct_8_0_00000001_for___align *)(local_340._0_8_ + 0x18))->field_0x6 =
                         'm';
                    ((anon_struct_8_0_00000001_for___align *)(local_340._0_8_ + 0x18))->field_0x7 =
                         '`';
                    ((anon_struct_8_0_00000001_for___align *)(local_340._0_8_ + 0x20))->field_0x0 =
                         ' ';
                    ((anon_struct_8_0_00000001_for___align *)(local_340._0_8_ + 0x20))->field_0x1 =
                         'v';
                    ((anon_struct_8_0_00000001_for___align *)(local_340._0_8_ + 0x20))->field_0x2 =
                         'a';
                    ((anon_struct_8_0_00000001_for___align *)(local_340._0_8_ + 0x20))->field_0x3 =
                         'r';
                    ((anon_struct_8_0_00000001_for___align *)(local_340._0_8_ + 0x20))->field_0x4 =
                         'i';
                    ((anon_struct_8_0_00000001_for___align *)(local_340._0_8_ + 0x20))->field_0x5 =
                         'a';
                    ((anon_struct_8_0_00000001_for___align *)(local_340._0_8_ + 0x20))->field_0x6 =
                         'b';
                    ((anon_struct_8_0_00000001_for___align *)(local_340._0_8_ + 0x20))->field_0x7 =
                         'i';
                    ((anon_struct_8_0_00000001_for___align *)(local_340._0_8_ + 0x28))->field_0x0 =
                         'l';
                    ((anon_struct_8_0_00000001_for___align *)(local_340._0_8_ + 0x28))->field_0x1 =
                         'i';
                    ((anon_struct_8_0_00000001_for___align *)(local_340._0_8_ + 0x28))->field_0x2 =
                         't';
                    ((anon_struct_8_0_00000001_for___align *)(local_340._0_8_ + 0x28))->field_0x3 =
                         'y';
                    ((anon_struct_8_0_00000001_for___align *)(local_340._0_8_ + 0x28))->field_0x4 =
                         '.';
                    local_340._8_8_ = local_288;
                    (&((anon_struct_8_0_00000001_for___align *)local_340._0_8_)->field_0x0)
                    [(long)local_288] = '\0';
                    fmt::format<std::__cxx11::string>
                              ((string *)local_1e8,(fmt *)local_340,&local_2b8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_288);
                    ::std::__cxx11::string::operator=((string *)&local_310,(string *)local_1e8);
                    if ((undefined1 *)local_1e8._0_8_ != local_1d8) {
                      operator_delete((void *)local_1e8._0_8_,local_1d8._0_8_ + 1);
                    }
                    if ((anon_struct_8_0_00000001_for___align *)local_340._0_8_ !=
                        (anon_struct_8_0_00000001_for___align *)(local_340 + 0x10)) {
                      operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
                    }
                    goto LAB_00217139;
                  }
                  if (p_Var22[5]._M_left == p_Var22[5]._M_parent) {
                    if (p_Var22[4]._M_right == (_Base_ptr)0x0) {
                      bVar14 = false;
                    }
                    else {
                      iVar15 = (**(code **)p_Var22[4]._M_right)();
                      bVar14 = iVar15 == 4;
                    }
                    lVar17 = 0x250;
                    if ((bVar14) || ((p_Var22[5]._M_color & _S_black) != _S_red)) goto LAB_00216f8f;
                    if ((p_Var22[4]._M_right != (_Base_ptr)0x0) &&
                       ((iVar15 = (**(code **)p_Var22[4]._M_right)(), iVar15 == 0 ||
                        ((p_Var22[4]._M_right != (_Base_ptr)0x0 &&
                         (iVar15 = (**(code **)p_Var22[4]._M_right)(), iVar15 == 1))))))
                    goto LAB_002170db;
                    Attribute::get_value<tinyusdz::Token>
                              ((optional<tinyusdz::Token> *)local_340,pAVar1);
                    sVar8 = local_340[0];
                    local_1e8[0] = (stringstream)local_340[0];
                    if (local_340[0] == (string)0x1) {
                      local_1e8._8_8_ = (long)local_1d8 + 8;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_340._8_8_ == &aStack_328) {
                        local_1d8._16_8_ = aStack_328._8_8_;
                      }
                      else {
                        local_1e8._8_8_ = local_340._8_8_;
                      }
                      local_1d8._8_8_ = aStack_328._M_allocated_capacity;
                      local_1d8._0_8_ = local_340._16_8_;
                      nonstd::optional_lite::optional<tinyusdz::Token>::operator=
                                (local_280,(Token *)(local_1e8 + 8));
                    }
                    else {
                      local_318._0_4_ = 4;
                      ::std::__cxx11::string::operator=
                                ((string *)&local_310,"Internal data corrupsed.");
                    }
                    if ((local_1e8[0] == (stringstream)0x1) &&
                       (local_1e8._8_8_ != (long)local_1d8 + 8)) {
                      operator_delete((void *)local_1e8._8_8_,(ulong)(local_1d8._8_8_ + 1));
                    }
                    if (sVar8 == (string)0x0) goto LAB_00217139;
                    goto LAB_002170e0;
                  }
                  local_318._0_4_ = 4;
                  err = (string *)0x58;
                  pcVar23 = 
                  "TimeSample or corrupted value assigned to a property where `uniform` variability is set."
                  ;
                }
                else {
LAB_002170db:
                  if (p_Var7 != p_Var6) goto LAB_002170e0;
                  local_318._0_4_ = 8;
                  err = (string *)0x18;
                  pcVar23 = "Internal data corrupsed.";
                }
                ::std::__cxx11::string::_M_replace
                          ((ulong)&local_310,0,(char *)local_308._M_allocated_capacity,
                           (ulong)pcVar23);
              }
            }
            else {
LAB_00216dbb:
              local_318._0_4_ = 3;
              ::std::__cxx11::stringstream::stringstream((stringstream *)local_1e8);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1d8,"Property type mismatch. ",0x18);
              poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1d8,local_2b8._M_dataplus._M_p,
                                   local_2b8._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," expects type `",0xf);
              local_340._8_8_ = (anon_struct_8_0_00000001_for___align)0x5;
              local_340._16_6_ = 0x6e656b6f74;
              local_340._0_8_ = paVar4;
              poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar16,(char *)paVar4,5);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        (poVar16,"` but defined as type `",0x17);
              poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar16,local_2f0._M_dataplus._M_p,local_2f0._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"`",1);
              if ((anon_struct_8_0_00000001_for___align *)local_340._0_8_ != paVar4) {
                operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
              }
              ::std::__cxx11::stringbuf::str();
              ::std::__cxx11::string::operator=((string *)&local_310,(string *)local_340);
              if ((anon_struct_8_0_00000001_for___align *)local_340._0_8_ != paVar4) {
                operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
              }
              ::std::__cxx11::stringstream::~stringstream((stringstream *)local_1e8);
              ::std::ios_base::~ios_base(local_168);
            }
LAB_00217139:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
              operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
            operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
          }
          if (local_258 != local_248) {
            operator_delete(local_258,local_248[0] + 1);
          }
          iVar15 = 0;
          if (((ulong)local_318 & 0xfffffffd) == 0) {
            iVar15 = 3;
LAB_002173cb:
            bVar14 = false;
          }
          else {
            bVar14 = true;
            if (local_318._0_4_ != 1) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1e8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1e8,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"():",3);
              poVar16 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1e8,0xf34);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
              local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_2f0,"Parsing attribute `{}` failed. Error: {}","");
              fmt::format<char[11],std::__cxx11::string>
                        ((string *)local_340,(fmt *)&local_2f0,(string *)"familyName",
                         (char (*) [11])&local_310,err);
              poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1e8,(char *)local_340._0_8_,local_340._8_8_);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
              paVar4 = (anon_struct_8_0_00000001_for___align *)(local_340 + 0x10);
              if ((anon_struct_8_0_00000001_for___align *)local_340._0_8_ != paVar4) {
                operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
              }
              pTVar9 = local_2d0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
                operator_delete(local_2f0._M_dataplus._M_p,
                                local_2f0.field_2._M_allocated_capacity + 1);
              }
              if (pTVar9 != (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>
                             *)0x0) {
                ::std::__cxx11::stringbuf::str();
                puVar18 = (undefined8 *)
                          ::std::__cxx11::string::_M_append
                                    ((char *)&local_2f0,(ulong)(pTVar9->_metas).interpolation);
                paVar2 = (anon_struct_8_0_00000001_for___align *)(puVar18 + 2);
                if ((anon_struct_8_0_00000001_for___align *)*puVar18 == paVar2) {
                  local_340._16_8_ = *paVar2;
                  aStack_328._M_allocated_capacity = puVar18[3];
                  local_340._0_8_ = paVar4;
                }
                else {
                  local_340._16_8_ = *paVar2;
                  local_340._0_8_ = (anon_struct_8_0_00000001_for___align *)*puVar18;
                }
                local_340._8_8_ = *(anon_struct_8_0_00000001_for___align *)(puVar18 + 1);
                *puVar18 = paVar2;
                puVar18[1] = 0;
                *(undefined1 *)(puVar18 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)pTVar9,(string *)local_340);
                if ((anon_struct_8_0_00000001_for___align *)local_340._0_8_ != paVar4) {
                  operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
                  operator_delete(local_2f0._M_dataplus._M_p,
                                  local_2f0.field_2._M_allocated_capacity + 1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
              ::std::ios_base::~ios_base(local_178);
              iVar15 = 1;
              goto LAB_002173cb;
            }
          }
          if (local_310 != local_308._M_local_buf + 8) {
            operator_delete(local_310,local_308._8_8_ + 1);
          }
          if (bVar14) {
            local_208[0] = local_1f8;
            local_2c0 = pAVar1;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)local_208,*(long *)(p_Var22 + 1),
                       (long)&(p_Var22[1]._M_parent)->_M_color + *(long *)(p_Var22 + 1));
            err = (string *)local_1e8;
            local_1e8._0_8_ = local_1d8;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)err,"indices","");
            (anonymous_namespace)::ParseTypedAttribute<std::vector<int,std::allocator<int>>>
                      ((ParseResult *)local_340,(_anonymous_namespace_ *)&local_238,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_208,(string *)local_2c0,(Property *)err,local_268,
                       in_stack_fffffffffffffcb8);
            if ((undefined1 *)local_1e8._0_8_ != local_1d8) {
              operator_delete((void *)local_1e8._0_8_,local_1d8._0_8_ + 1);
            }
            if (local_208[0] != local_1f8) {
              operator_delete(local_208[0],local_1f8[0] + 1);
            }
            iVar15 = 0;
            if ((local_340._0_8_ & 0xfffffffd) == 0) {
              iVar15 = 3;
LAB_002176f9:
              bVar14 = false;
            }
            else {
              bVar14 = true;
              if (local_340._0_4_ != Unmatched) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1e8,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1e8,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1e8,"ReconstructPrim",0xf);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"():",3);
                poVar16 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1e8,0xf35);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
                local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_2f0,"Parsing attribute `{}` failed. Error: {}","");
                fmt::format<char[8],std::__cxx11::string>
                          ((string *)local_318,(fmt *)&local_2f0,(string *)"indices",
                           (char (*) [8])(local_340 + 8),err);
                poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1e8,(char *)local_318,(long)local_310);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
                if (local_318 != (undefined1  [8])&local_308) {
                  operator_delete((void *)local_318,(ulong)(local_308._M_allocated_capacity + 1));
                }
                pTVar9 = local_2d0;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
                  operator_delete(local_2f0._M_dataplus._M_p,
                                  local_2f0.field_2._M_allocated_capacity + 1);
                }
                if (pTVar9 != (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>
                               *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  plVar19 = (long *)::std::__cxx11::string::_M_append
                                              ((char *)&local_2f0,
                                               (ulong)(pTVar9->_metas).interpolation);
                  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)(plVar19 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar19 == paVar3) {
                    local_308._M_allocated_capacity = paVar3->_M_allocated_capacity;
                    local_308._8_8_ = plVar19[3];
                    local_318 = (undefined1  [8])&local_308;
                  }
                  else {
                    local_308._M_allocated_capacity = paVar3->_M_allocated_capacity;
                    local_318 = (undefined1  [8])*plVar19;
                  }
                  local_310 = (char *)plVar19[1];
                  *plVar19 = (long)paVar3;
                  plVar19[1] = 0;
                  *(undefined1 *)(plVar19 + 2) = 0;
                  ::std::__cxx11::string::operator=((string *)pTVar9,(string *)local_318);
                  if (local_318 != (undefined1  [8])&local_308) {
                    operator_delete((void *)local_318,(ulong)(local_308._M_allocated_capacity + 1));
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
                    operator_delete(local_2f0._M_dataplus._M_p,
                                    local_2f0.field_2._M_allocated_capacity + 1);
                  }
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
                ::std::ios_base::~ios_base(local_178);
                iVar15 = 1;
                goto LAB_002176f9;
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_340._8_8_ != &aStack_328) {
              operator_delete((void *)local_340._8_8_,(ulong)(aStack_328._M_allocated_capacity + 1))
              ;
            }
            if (!bVar14) goto LAB_00217ecc;
            p_Var6 = p_Var22 + 1;
            iVar15 = ::std::__cxx11::string::compare((char *)p_Var6);
            if (iVar15 == 0) {
              local_1e8._0_8_ = local_1d8;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1e8,"elementType","");
              cVar20 = ::std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::find(&local_238,(key_type *)local_1e8);
              if ((undefined1 *)local_1e8._0_8_ != local_1d8) {
                operator_delete((void *)local_1e8._0_8_,local_1d8._0_8_ + 1);
              }
              pAVar1 = local_2c0;
              if ((_Rb_tree_header *)cVar20._M_node == &local_238._M_impl.super__Rb_tree_header) {
                paVar4 = (anon_struct_8_0_00000001_for___align *)(local_340 + 0x10);
                if (((ulong)p_Var22[0x17]._M_parent & 0xfffffffe00000000) != 0x200000000) {
                  Attribute::type_name_abi_cxx11_((string *)local_1e8,local_2c0);
                  local_340._8_8_ = (anon_struct_8_0_00000001_for___align)0x5;
                  local_340._16_6_ = 0x6e656b6f74;
                  if ((((anon_struct_8_0_00000001_for___align)local_1e8._8_8_ ==
                        (anon_struct_8_0_00000001_for___align)0x5) &&
                      ((char)*(int *)(local_1e8._0_8_ + 4) == 'n' &&
                       *(int *)local_1e8._0_8_ == 0x656b6f74)) &&
                     (uVar5 = *(uint *)((long)&p_Var22[0x17]._M_parent + 4), uVar5 < 2)) {
                    local_340._0_8_ = paVar4;
                    if ((undefined1 *)local_1e8._0_8_ != local_1d8) {
                      operator_delete((void *)local_1e8._0_8_,local_1d8._0_8_ + 1);
                    }
                    if (uVar5 == 0) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1e8,"[warn]",6);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1e8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                 ,0x5a);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1e8,":",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1e8,"ReconstructPrim",0xf);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1e8,"():",3);
                      poVar16 = (ostream *)
                                ::std::ostream::operator<<((ostringstream *)local_1e8,0xf36);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1e8,"No value assigned to `",0x16);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1e8,"elementType",0xb);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1e8,"` token attribute. Set default token value.",
                                 0x2b);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1e8,"\n",1);
                      pPVar12 = local_298;
                      psVar10 = local_2c8;
                      if (local_2c8 != (string *)0x0) {
                        ::std::__cxx11::stringbuf::str();
                        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_340,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_318,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_2d0);
                        ::std::__cxx11::string::operator=((string *)psVar10,(string *)local_340);
                        if ((anon_struct_8_0_00000001_for___align *)local_340._0_8_ != paVar4) {
                          operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
                        }
                        if (local_318 != (undefined1  [8])&local_308) {
                          operator_delete((void *)local_318,
                                          (ulong)(local_308._M_allocated_capacity + 1));
                        }
                      }
                      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
                      ::std::ios_base::~ios_base(local_178);
                      AttrMetas::operator=((AttrMetas *)pPVar12,(AttrMetas *)(p_Var22 + 7));
                      local_1e8._0_8_ = local_1d8;
                      ::std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_1e8,"elementType","");
                      ::std::
                      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      ::_M_insert_unique<std::__cxx11::string>
                                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                  *)&local_238,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_1e8);
                      if ((undefined1 *)local_1e8._0_8_ != local_1d8) {
                        operator_delete((void *)local_1e8._0_8_,local_1d8._0_8_ + 1);
                      }
                      goto LAB_00217edb;
                    }
                  }
                  else if ((undefined1 *)local_1e8._0_8_ != local_1d8) {
                    local_340._0_8_ = paVar4;
                    operator_delete((void *)local_1e8._0_8_,local_1d8._0_8_ + 1);
                  }
                }
                local_1e8._0_8_ = (int *)0x0;
                local_1e8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
                local_1d8._8_8_ =
                     ::std::
                     _Function_handler<nonstd::expected_lite::expected<tinyusdz::GeomSubset::ElementType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc:3869:29)>
                     ::_M_invoke;
                local_1d8._0_8_ =
                     ::std::
                     _Function_handler<nonstd::expected_lite::expected<tinyusdz::GeomSubset::ElementType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc:3869:29)>
                     ::_M_manager;
                local_340._0_8_ = paVar4;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_340,"elementType","");
                bVar14 = options->strict_allowedToken_check;
                local_58._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
                local_58._24_8_ = (code *)0x0;
                local_58.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
                local_58._8_8_ = 0;
                if ((anon_struct_8_0_00000001_for___align)local_1d8._0_8_ !=
                    (anon_struct_8_0_00000001_for___align)0x0) {
                  (*(code *)local_1d8._0_8_)(&local_58,local_1e8,2);
                  local_58._16_8_ = local_1d8._0_8_;
                  local_58._24_8_ = local_1d8._8_8_;
                }
                pPVar12 = local_298;
                err = (string *)local_298;
                in_stack_fffffffffffffcb8 = local_2d0;
                bVar14 = ParseUniformEnumProperty<tinyusdz::GeomSubset::ElementType,tinyusdz::GeomSubset::ElementType>
                                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_340,bVar14,
                                    (EnumHandlerFun<tinyusdz::GeomSubset::ElementType> *)&local_58,
                                    pAVar1,(TypedAttributeWithFallback<tinyusdz::GeomSubset::ElementType>
                                            *)local_298,local_2c8,(string *)local_2d0);
                if ((anon_struct_8_0_00000001_for___align)local_58._16_8_ !=
                    (anon_struct_8_0_00000001_for___align)0x0) {
                  (*(code *)local_58._16_8_)(&local_58,&local_58,3);
                }
                if ((anon_struct_8_0_00000001_for___align *)local_340._0_8_ != paVar4) {
                  operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
                }
                iVar15 = 1;
                if (bVar14) {
                  AttrMetas::operator=((AttrMetas *)pPVar12,(AttrMetas *)(p_Var22 + 7));
                  local_340._0_8_ = (anon_struct_8_0_00000001_for___align *)(local_340 + 0x10);
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_340,"elementType","");
                  ::std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)&local_238,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_340);
                  if ((anon_struct_8_0_00000001_for___align *)local_340._0_8_ !=
                      (anon_struct_8_0_00000001_for___align *)(local_340 + 0x10)) {
                    operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
                  }
                  iVar15 = 3;
                }
                if ((anon_struct_8_0_00000001_for___align)local_1d8._0_8_ !=
                    (anon_struct_8_0_00000001_for___align)0x0) {
                  (*(code *)local_1d8._0_8_)(local_1e8,local_1e8,3);
                }
                goto LAB_00217ecc;
              }
            }
            else {
              cVar20 = ::std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::find(&local_238,(key_type *)p_Var6);
              p_Var24 = &local_238._M_impl.super__Rb_tree_header;
              if ((_Rb_tree_header *)cVar20._M_node == p_Var24) {
                pmVar21 = ::std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                          ::operator[](local_278,(key_type *)p_Var6);
                ::std::__cxx11::string::_M_assign((string *)pmVar21);
                (pmVar21->_attrib)._varying_authored = (bool)p_Var22[3].field_0x4;
                (pmVar21->_attrib)._variability = p_Var22[3]._M_color;
                ::std::__cxx11::string::_M_assign((string *)&(pmVar21->_attrib)._type_name);
                linb::any::operator=((any *)&(pmVar21->_attrib)._var,(any *)&p_Var22[4]._M_parent);
                (pmVar21->_attrib)._var._blocked = SUB41(p_Var22[5]._M_color,0);
                ::std::
                vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                ::operator=((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                             *)&(pmVar21->_attrib)._var._ts,
                            (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                             *)&p_Var22[5]._M_parent);
                (pmVar21->_attrib)._var._ts._dirty = SUB41(p_Var22[6]._M_color,0);
                std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                          (&(pmVar21->_attrib)._paths,
                           (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                           &p_Var22[6]._M_parent);
                AttrMetas::operator=(&(pmVar21->_attrib)._metas,(AttrMetas *)(p_Var22 + 7));
                *(_Base_ptr *)&pmVar21->_listOpQual = p_Var22[0x17]._M_parent;
                (pmVar21->_rel).type = *(Type *)&p_Var22[0x17]._M_left;
                Path::operator=(&(pmVar21->_rel).targetPath,(Path *)&p_Var22[0x17]._M_right);
                std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                          (&(pmVar21->_rel).targetPathVector,
                           (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                           &p_Var22[0x1e]._M_parent);
                (pmVar21->_rel).listOpQual = p_Var22[0x1f]._M_color;
                AttrMetas::operator=(&(pmVar21->_rel)._metas,(AttrMetas *)&p_Var22[0x1f]._M_parent);
                (pmVar21->_rel)._varying_authored = *(bool *)&p_Var22[0x2f]._M_left;
                ::std::__cxx11::string::_M_assign((string *)&pmVar21->_prop_value_type_name);
                pmVar21->_has_custom = *(bool *)&p_Var22[0x30]._M_right;
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&local_238,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           p_Var6);
              }
              cVar20 = ::std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::find(&local_238,(key_type *)p_Var6);
              if ((_Rb_tree_header *)cVar20._M_node == p_Var24) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1e8,"[warn]",6);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1e8,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1e8,"ReconstructPrim",0xf);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"():",3);
                poVar16 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1e8,0xf38);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_340,"Unsupported/unimplemented property: ",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)p_Var6);
                poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1e8,(char *)local_340._0_8_,local_340._8_8_);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
                paVar4 = (anon_struct_8_0_00000001_for___align *)(local_340 + 0x10);
                if ((anon_struct_8_0_00000001_for___align *)local_340._0_8_ != paVar4) {
                  operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
                }
                psVar10 = local_2c8;
                if (local_2c8 != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  puVar18 = (undefined8 *)
                            ::std::__cxx11::string::_M_append
                                      (local_318,(ulong)(local_2d0->_metas).interpolation);
                  paVar2 = (anon_struct_8_0_00000001_for___align *)(puVar18 + 2);
                  if ((anon_struct_8_0_00000001_for___align *)*puVar18 == paVar2) {
                    local_340._16_8_ = *paVar2;
                    aStack_328._M_allocated_capacity = puVar18[3];
                    local_340._0_8_ = paVar4;
                  }
                  else {
                    local_340._16_8_ = *paVar2;
                    local_340._0_8_ = (anon_struct_8_0_00000001_for___align *)*puVar18;
                  }
                  local_340._8_8_ = *(anon_struct_8_0_00000001_for___align *)(puVar18 + 1);
                  *puVar18 = paVar2;
                  puVar18[1] = 0;
                  *(undefined1 *)(puVar18 + 2) = 0;
                  ::std::__cxx11::string::operator=((string *)psVar10,(string *)local_340);
                  if ((anon_struct_8_0_00000001_for___align *)local_340._0_8_ != paVar4) {
                    operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
                  }
                  if (local_318 != (undefined1  [8])&local_308) {
                    operator_delete((void *)local_318,(ulong)(local_308._M_allocated_capacity + 1));
                  }
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
                ::std::ios_base::~ios_base(local_178);
              }
            }
          }
          else {
LAB_00217ecc:
            if ((iVar15 != 3) && (iVar15 != 0)) goto LAB_00218054;
          }
LAB_00217edb:
          p_Var22 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var22);
        } while (p_Var22 != local_260);
        bVar25 = true;
      }
    }
    else {
LAB_00218054:
      bVar25 = false;
    }
  }
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&local_238,(_Link_type)local_238._M_impl.super__Rb_tree_header._M_header._M_parent);
  return bVar25;
}

Assistant:

bool ReconstructPrim<GeomSubset>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    GeomSubset *subset,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {

  (void)spec;
  (void)references;

  DCOUT("GeomSubset");

  // Currently schema only allows 'face'
  auto ElementTypeHandler = [](const std::string &tok)
      -> nonstd::expected<GeomSubset::ElementType, std::string> {
    using EnumTy = std::pair<GeomSubset::ElementType, const char *>;
    const std::vector<EnumTy> enums = {
        std::make_pair(GeomSubset::ElementType::Face, "face"),
        std::make_pair(GeomSubset::ElementType::Point, "point"),
    };
    return EnumHandler<GeomSubset::ElementType>("elementType", tok,
                                                    enums);
  };

  std::set<std::string> table;

  if (!prim::ReconstructMaterialBindingProperties(table, properties, subset, err)) {
    return false;
  }

  if (!prim::ReconstructCollectionProperties(
    table, properties, subset, warn, err, options.strict_allowedToken_check)) {
    return false;
  }

  for (const auto &prop : properties) {
    PARSE_TYPED_ATTRIBUTE(table, prop, "familyName", GeomSubset, subset->familyName)
    PARSE_TYPED_ATTRIBUTE(table, prop, "indices", GeomSubset, subset->indices)
    PARSE_UNIFORM_ENUM_PROPERTY(table, prop, "elementType", GeomSubset::ElementType, ElementTypeHandler, GeomSubset, subset->elementType, options.strict_allowedToken_check)
    ADD_PROPERTY(table, prop, GeomSubset, subset->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }

  return true;
}